

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O1

int abbrev_compare(void *v1,void *v2)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if (*v2 <= *v1) {
    uVar1 = (uint)(*v2 < *v1);
  }
  return uVar1;
}

Assistant:

static int
abbrev_compare (const void *v1, const void *v2)
{
  const struct abbrev *a1 = (const struct abbrev *) v1;
  const struct abbrev *a2 = (const struct abbrev *) v2;

  if (a1->code < a2->code)
    return -1;
  else if (a1->code > a2->code)
    return 1;
  else
    {
      /* This really shouldn't happen.  It means there are two
	 different abbrevs with the same code, and that means we don't
	 know which one lookup_abbrev should return.  */
      return 0;
    }
}